

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wi_stuff.cpp
# Opt level: O0

void WI_Ticker(void)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  
  bcnt = bcnt + 1;
  if (bcnt == 1) {
    bVar1 = FString::IsNotEmpty(&(level.info)->InterMusic);
    if (bVar1) {
      pcVar3 = FString::operator_cast_to_char_(&(level.info)->InterMusic);
      S_ChangeMusic(pcVar3,(level.info)->intermusicorder,true,false);
    }
    else {
      pcVar3 = FString::GetChars(&gameinfo.intermissionMusic);
      S_ChangeMusic(pcVar3,gameinfo.intermissionOrder,true,false);
    }
  }
  WI_checkForAccelerate();
  switch(state) {
  case StatCount:
    iVar2 = FIntCVar::operator_cast_to_int(&deathmatch);
    if (iVar2 == 0) {
      if ((multiplayer & 1U) == 0) {
        WI_updateStats();
      }
      else {
        WI_updateNetgameStats();
      }
    }
    else {
      WI_updateDeathmatchStats();
    }
    break;
  case ShowNextLoc:
    WI_updateShowNextLoc();
    break;
  case LeavingIntermission:
    break;
  case NoState:
    WI_updateNoState();
  }
  return;
}

Assistant:

void WI_Ticker(void)
{
	// counter for general background animation
	bcnt++;  
	
	if (bcnt == 1)
	{
		// intermission music - use the defaults if none specified
		if (level.info->InterMusic.IsNotEmpty()) 
			S_ChangeMusic(level.info->InterMusic, level.info->intermusicorder);
		else
			S_ChangeMusic (gameinfo.intermissionMusic.GetChars(), gameinfo.intermissionOrder); 

	}
	
	WI_checkForAccelerate();
	
	switch (state)
	{
    case StatCount:
		if (deathmatch) WI_updateDeathmatchStats();
		else if (multiplayer) WI_updateNetgameStats();
		else WI_updateStats();
		break;
		
    case ShowNextLoc:
		WI_updateShowNextLoc();
		break;
		
    case NoState:
		WI_updateNoState();
		break;

	case LeavingIntermission:
		// Hush, GCC.
		break;
	}
}